

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void codeAuthenticatorTest(void)

{
  C *pCVar1;
  bool result;
  char *fileName;
  size_t i;
  char *fileNameTable [5];
  char publicKeyPem [452];
  CodeAuthenticator authenticator;
  FILE *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  byte in_stack_fffffffffffffd2f;
  CodeAuthenticator *in_stack_fffffffffffffd30;
  ulong local_280;
  undefined8 local_278 [15];
  StringRef *in_stack_fffffffffffffe00;
  CodeAuthenticator *in_stack_fffffffffffffe08;
  
  axl::sys::CodeAuthenticator::CodeAuthenticator(in_stack_fffffffffffffd30);
  __wrap_memcpy(in_stack_fffffffffffffd30,
                (void *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                (size_t)in_stack_fffffffffffffd20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffffd30,
             (C *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffffd30,
             (C *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  axl::sys::CodeAuthenticator::setup
            (in_stack_fffffffffffffd30,
             (StringRef *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (StringRef *)in_stack_fffffffffffffd20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11bcb6);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11bcc3);
  __wrap_memcpy(in_stack_fffffffffffffd30,
                (void *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                (size_t)in_stack_fffffffffffffd20);
  for (local_280 = 0; local_280 < 5; local_280 = local_280 + 1) {
    printf("Verifying %s...\n",local_278[local_280]);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffffd30,
               (C *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    in_stack_fffffffffffffd2f =
         axl::sys::CodeAuthenticator::verifyFile
                   (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11bd45);
    if ((in_stack_fffffffffffffd2f & 1) == 0) {
      in_stack_fffffffffffffd20 = _stderr;
      axl::err::getLastErrorDescription();
      pCVar1 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          in_stack_fffffffffffffd20);
      fprintf(in_stack_fffffffffffffd20,"Error: %s...\n",pCVar1);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11bda6);
    }
  }
  printf("Done.\n");
  axl::sys::CodeAuthenticator::~CodeAuthenticator((CodeAuthenticator *)in_stack_fffffffffffffd20);
  return;
}

Assistant:

void
codeAuthenticatorTest() {
	sys::CodeAuthenticator authenticator;

#if (_AXL_OS_WIN)
#	define JNC_LIB_DIR "c:/Projects/repos/ioninja/jancy/build/make-amd64/bin/Debug"

	authenticator.setup("Tibbo Technology Inc.");
#elif (_AXL_OS_LINUX)
#	define JNC_LIB_DIR "/home/vladimir/Projects/repos/ioninja/jancy/build/make-amd64/lib/Debug"

	const char publicKeyPem[] =
		"-----BEGIN PUBLIC KEY-----\n"
		"MIIBIjANBgkqhkiG9w0BAQEFAAOCAQ8AMIIBCgKCAQEAqlJw5tH4SYipoxczk3S9\n"
		"pIYV/H5old8TGzQ0Mq2AFLhW0aBewsuQOJUxLdzu4ym+KNpV2+6tp9qZFpa/zu7S\n"
		"qzztgvnWsL4EsdqXGLfTDa+rM9GlhsrDchF4a13V10fKBtBlCn1OSBLYY1BWkrjK\n"
		"66rv4J/8uGuhZi9ufZh3jML0aFUklPIiPly6ndRMnxKFqqwqSy6ymDn3kAdHZfMp\n"
		"c21hG26vjG7guYflmd4krvF8++yBUGJV9ToT5BKF4pzUGh9Pt7lt+MAUdJnTT9ZF\n"
		"6SyVnDkMM8s5DK8lblKrxur4LRsX0CJ1557T6fFWgXsEnyqFWUm8fVJKaRoozOjl\n"
		"zQIDAQAB\n"
		 "-----END PUBLIC KEY-----\n";

	authenticator.setup(".njsig", publicKeyPem);
#elif (_AXL_OS_DARWIN)
#	define JNC_LIB_DIR "/Users/vladimir/Projects/ioninja/jancy/build/make-amd64/lib/Debug"

	sec::registerErrorProvider();
	authenticator.setup("MHV447DZEV");
#endif

	const char* fileNameTable[] = {
		JNC_LIB_DIR "/io_base-amd64.bin",
		JNC_LIB_DIR "/io_pcap-amd64.bin",
		JNC_LIB_DIR "/io_ssh-amd64.bin",
		JNC_LIB_DIR "/io_ssl-amd64.bin",
		JNC_LIB_DIR "/io_usb-amd64.bin",
	};

	for (size_t i = 0; i < countof(fileNameTable); i++) {
		const char* fileName = fileNameTable[i];
		printf("Verifying %s...\n", fileName);

		bool result = authenticator.verifyFile(fileName);
		if (!result)
			fprintf(stderr, "Error: %s...\n", err::getLastErrorDescription().sz());
	}

	printf("Done.\n");
}